

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O2

void h261_print_picparm(h261_picparm *picparm)

{
  uint uVar1;
  char *__format;
  
  puts("Picture header:");
  printf("\tTR = %d\n",(ulong)picparm->tr);
  printf("\tPTYPE = 0x%02x [",(ulong)picparm->ptype);
  uVar1 = picparm->ptype;
  if ((uVar1 & 0x20) != 0) {
    printf("SPLIT_SCREEN ");
    uVar1 = picparm->ptype;
  }
  if ((uVar1 & 0x10) != 0) {
    printf("DOCUMENT_CAMERA ");
    uVar1 = picparm->ptype;
  }
  if ((uVar1 & 8) != 0) {
    printf("FREEZE_RELEASE ");
    uVar1 = picparm->ptype;
  }
  __format = "CIF";
  if ((uVar1 & 4) == 0) {
    __format = "QCIF";
  }
  printf(__format);
  if ((picparm->ptype & 2) == 0) {
    printf(" HI_RES");
  }
  puts("]");
  return;
}

Assistant:

void h261_print_picparm(struct h261_picparm *picparm) {
	printf("Picture header:\n");
	printf("\tTR = %d\n", picparm->tr);
	printf("\tPTYPE = 0x%02x [", picparm->ptype);
	if (picparm->ptype & 0x20)
		printf("SPLIT_SCREEN ");
	if (picparm->ptype & 0x10)
		printf("DOCUMENT_CAMERA ");
	if (picparm->ptype & 0x08)
		printf("FREEZE_RELEASE ");
	if (!(picparm->ptype & 0x04))
		printf("QCIF");
	else
		printf("CIF");
	if (!(picparm->ptype & 0x02))
		printf(" HI_RES");
	printf("]\n");
}